

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastStFld
          (Lowerer *this,Instr *instrStFld,JnHelperMethod helperMethod,
          JnHelperMethod polymorphicHelperMethod,LabelInstr **labelBailOut,RegOpnd *typeOpnd,
          bool *pIsHelper,LabelInstr **pLabelHelper,bool withPutFlags,PropertyOperationFlags flags)

{
  uint uVar1;
  SymOpnd *this_00;
  Opnd *opndSrc;
  Sym *pSVar2;
  JITTimePolymorphicInlineCache *pJVar3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  uint16 uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  PropertySymOpnd *propertySymOpnd;
  JITTimeFunctionBody *pJVar14;
  FunctionJITTimeInfo *pFVar15;
  char16 *pcVar16;
  char16 *pcVar17;
  LabelInstr *pLVar18;
  RegOpnd *opndBase;
  RegOpnd *opndInlineCache;
  intptr_t address;
  AddrOpnd *src;
  LabelInstr *labelNext;
  BranchInstr *branchRef;
  byte bVar19;
  Lowerer *pLVar20;
  char16_t *pcVar21;
  char16_t *pcVar22;
  bool bVar23;
  wchar local_e8 [4];
  char16 debugStringBuffer [42];
  RegOpnd *local_70;
  RegOpnd *local_68;
  
  this_00 = (SymOpnd *)instrStFld->m_dst;
  opndSrc = instrStFld->m_src1;
  OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar5 == OpndKindSym) {
    OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar6) goto LAB_005d3ad8;
      *puVar13 = 0;
    }
    bVar6 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (!bVar6) goto LAB_005d30d4;
    OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar6) goto LAB_005d3ad8;
      *puVar13 = 0;
    }
    if (this_00->m_sym->m_kind != SymKindProperty) goto LAB_005d30d4;
  }
  else {
LAB_005d30d4:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x596e,
                       "(opndDst->IsSymOpnd() && opndDst->AsSymOpnd()->IsPropertySymOpnd() && opndDst->AsSymOpnd()->m_sym->IsPropertySym())"
                       ,"Expected PropertySym as dst of StFld");
    if (!bVar6) goto LAB_005d3ad8;
    *puVar13 = 0;
  }
  propertySymOpnd = IR::Opnd::AsPropertySymOpnd((Opnd *)this_00);
  pSVar2 = (propertySymOpnd->super_SymOpnd).m_sym;
  if (pSVar2->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar6) goto LAB_005d3ad8;
    *puVar13 = 0;
  }
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,ObjTypeSpecPhase,uVar11,uVar12);
  if (bVar6) {
    pcVar16 = Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode);
    uVar1 = *(uint *)&pSVar2[1]._vptr_Sym;
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar14);
    Output::Print(L"Field store: %s, property ID: %u, func: %s, cache ID: %d, cloned cache: false\n"
                  ,pcVar16,(ulong)uVar1,pcVar17);
    Output::Flush();
  }
  if (pIsHelper == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x597b,"(pIsHelper != nullptr)","pIsHelper != nullptr");
    if (!bVar6) goto LAB_005d3ad8;
    *puVar13 = 0;
  }
  if (pLabelHelper == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x597e,"(pLabelHelper != nullptr)","pLabelHelper != nullptr");
    if (!bVar6) goto LAB_005d3ad8;
    *puVar13 = 0;
  }
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ProfileBasedFldFastPathPhase,uVar11,uVar12);
  bVar6 = true;
  if (bVar7) {
    bVar19 = 0;
    bVar7 = true;
    bVar23 = true;
  }
  else if (instrStFld->m_kind == InstrKindProfiled) {
    bVar19 = *(byte *)((long)&instrStFld[1]._vptr_Instr + 2);
    if (bVar19 == 0) {
      bVar9 = ValueType::IsUninitialized((ValueType *)(instrStFld + 1));
LAB_005d34a2:
      bVar6 = true;
      bVar19 = 0;
      bVar7 = true;
      bVar23 = true;
    }
    else {
      if ((bVar19 & 5) == 0) {
        bVar9 = false;
        goto LAB_005d34a2;
      }
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,AddFldFastPathPhase,uVar11,uVar12);
      if (bVar6) {
        pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
        pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,AddFldFastPathPhase,uVar11,uVar12);
        if (bVar6) {
          pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
          pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar14);
          pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar15,(wchar (*) [42])local_e8);
          Output::Print(L"AddFldFastPath: function: %s(%s) property ID: %u no fast path, because the phase is off.\n"
                        ,pcVar16,pcVar17,(ulong)*(uint *)&pSVar2[1]._vptr_Sym);
          Output::Flush();
        }
        bVar23 = true;
        bVar19 = 0;
      }
      else {
        bVar19 = *(byte *)((long)&instrStFld[1]._vptr_Instr + 2);
        bVar23 = (bVar19 & 5) != 4;
        bVar19 = bVar19 >> 2;
      }
      bVar8 = *(byte *)((long)&instrStFld[1]._vptr_Instr + 2) & 0x60;
      bVar6 = bVar8 != 0x20;
      bVar7 = bVar8 != 0x40;
      bVar9 = true;
    }
    if (bVar9 == false) {
      return false;
    }
  }
  else {
    bVar19 = 0;
    bVar7 = true;
    bVar23 = true;
  }
  if ((!bVar23) && ((bVar19 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x59bb,"(doStore || doAdd)","doStore || doAdd");
    if (!bVar9) goto LAB_005d3ad8;
    *puVar13 = 0;
  }
  if (*pLabelHelper == (LabelInstr *)0x0) {
    pLVar18 = IR::LabelInstr::New(Label,this->m_func,true);
    *pLabelHelper = pLVar18;
  }
  pLVar18 = IR::Instr::GetOrCreateContinueLabel(instrStFld,false);
  opndBase = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,this->m_func);
  pJVar3 = propertySymOpnd->m_runtimePolymorphicInlineCache;
  if ((bVar19 & 1) != 0) {
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
    bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,AddFldFastPathPhase,uVar11,uVar12);
    if (bVar9) {
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      pcVar17 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar15,(wchar (*) [42])local_e8);
      pcVar21 = L"poly";
      if (pJVar3 == (JITTimePolymorphicInlineCache *)0x0) {
        pcVar21 = L"mono";
      }
      pcVar22 = L"add only";
      if (bVar23) {
        pcVar22 = L"store and add";
      }
      Output::Print(L"AddFldFastPath: function: %s(%s) property ID: %d %s fast path for %s.\n",
                    pcVar16,pcVar17,(ulong)*(uint *)&pSVar2[1]._vptr_Sym,pcVar21,pcVar22);
      Output::Flush();
    }
  }
  opndInlineCache = IR::RegOpnd::New(TyUint64,this->m_func);
  if (pJVar3 == (JITTimePolymorphicInlineCache *)0x0) {
    src = (AddrOpnd *)LoadRuntimeInlineCacheOpnd(this,instrStFld,propertySymOpnd,*pIsHelper);
  }
  else {
    address = JITTimePolymorphicInlineCache::GetInlineCachesAddr
                        (propertySymOpnd->m_runtimePolymorphicInlineCache);
    src = IR::AddrOpnd::New(address,AddrOpndKindDynamicInlineCache,this->m_func,true,(Var)0x0);
  }
  InsertMove(&opndInlineCache->super_Opnd,&src->super_Opnd,instrStFld,true);
  local_68 = typeOpnd;
  if (typeOpnd == (RegOpnd *)0x0) {
    local_68 = IR::RegOpnd::New(TyUint64,this->m_func);
    GenerateObjectTestAndTypeLoad(this,instrStFld,opndBase,local_68,*pLabelHelper);
  }
  if (pJVar3 != (JITTimePolymorphicInlineCache *)0x0) {
    uVar10 = JITTimePolymorphicInlineCache::GetSize
                       (propertySymOpnd->m_runtimePolymorphicInlineCache);
    LowererMD::GenerateLoadPolymorphicInlineCacheSlot
              (instrStFld,opndInlineCache,local_68,(uint)uVar10);
  }
  if (bVar23) {
    if (bVar7) {
      labelNext = IR::LabelInstr::New(Label,this->m_func,*pIsHelper);
      branchRef = GenerateLocalInlineCacheCheck(instrStFld,local_68,opndInlineCache,labelNext,false)
      ;
      LowererMD::GenerateStFldFromLocalInlineCache
                (&this->m_lowererMD,instrStFld,opndBase,opndSrc,opndInlineCache,pLVar18,true);
      IR::Instr::InsertBefore(instrStFld,&labelNext->super_Instr);
    }
    else {
      labelNext = (LabelInstr *)0x0;
      branchRef = (BranchInstr *)0x0;
    }
    if (bVar6) {
      local_70 = IR::RegOpnd::New(TyUint64,this->m_func);
      LowererMD::GenerateLoadTaggedType(instrStFld,local_68,local_70);
      labelNext = IR::LabelInstr::New(Label,this->m_func,*pIsHelper);
      branchRef = GenerateLocalInlineCacheCheck(instrStFld,local_70,opndInlineCache,labelNext,false)
      ;
      LowererMD::GenerateStFldFromLocalInlineCache
                (&this->m_lowererMD,instrStFld,opndBase,opndSrc,opndInlineCache,pLVar18,false);
      IR::Instr::InsertBefore(instrStFld,&labelNext->super_Instr);
    }
    else {
      local_70 = (RegOpnd *)0x0;
    }
  }
  else {
    labelNext = (LabelInstr *)0x0;
    local_70 = (RegOpnd *)0x0;
    branchRef = (BranchInstr *)0x0;
  }
  if ((bVar19 & 1) != 0) {
    if (bVar7) {
      labelNext = IR::LabelInstr::New(Label,this->m_func,*pIsHelper);
      pLVar20 = (Lowerer *)instrStFld;
      branchRef = GenerateLocalInlineCacheCheck(instrStFld,local_68,opndInlineCache,labelNext,true);
      GenerateSetObjectTypeFromInlineCache(pLVar20,instrStFld,opndBase,opndInlineCache,false);
      LowererMD::GenerateStFldFromLocalInlineCache
                (&this->m_lowererMD,instrStFld,opndBase,opndSrc,opndInlineCache,pLVar18,true);
      IR::Instr::InsertBefore(instrStFld,&labelNext->super_Instr);
    }
    if (bVar6) {
      if (local_70 == (RegOpnd *)0x0) {
        local_70 = IR::RegOpnd::New(TyUint64,this->m_func);
        LowererMD::GenerateLoadTaggedType(instrStFld,local_68,local_70);
      }
      labelNext = IR::LabelInstr::New(Label,this->m_func,false);
      pLVar20 = (Lowerer *)instrStFld;
      branchRef = GenerateLocalInlineCacheCheck(instrStFld,local_70,opndInlineCache,labelNext,true);
      GenerateAuxSlotAdjustmentRequiredCheck(pLVar20,instrStFld,opndInlineCache,*pLabelHelper);
      GenerateSetObjectTypeFromInlineCache(pLVar20,instrStFld,opndBase,opndInlineCache,true);
      LowererMD::GenerateStFldFromLocalInlineCache
                (&this->m_lowererMD,instrStFld,opndBase,opndSrc,opndInlineCache,pLVar18,false);
      IR::Instr::InsertBefore(instrStFld,&labelNext->super_Instr);
    }
  }
  if (branchRef == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a1c,"(lastBranchToNext)","lastBranchToNext");
    if (!bVar6) goto LAB_005d3ad8;
    *puVar13 = 0;
  }
  pLVar18 = *pLabelHelper;
  if (branchRef->m_isMultiBranch == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
    if (!bVar6) {
LAB_005d3ad8:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar13 = 0;
  }
  if (branchRef->m_branchTarget != (LabelInstr *)0x0) {
    IR::LabelInstr::RemoveLabelRef(branchRef->m_branchTarget,branchRef);
  }
  if (pLVar18 != (LabelInstr *)0x0) {
    IR::LabelInstr::AddLabelRef(pLVar18,branchRef);
  }
  branchRef->m_branchTarget = pLVar18;
  IR::Instr::Remove(&labelNext->super_Instr);
  *pIsHelper = true;
  return false;
}

Assistant:

bool
Lowerer::GenerateFastStFld(IR::Instr * const instrStFld, IR::JnHelperMethod helperMethod, IR::JnHelperMethod polymorphicHelperMethod, IR::LabelInstr ** labelBailOut, IR::RegOpnd* typeOpnd,
    bool* pIsHelper, IR::LabelInstr** pLabelHelper, bool withPutFlags, Js::PropertyOperationFlags flags)
{
    // Generates:
    //
    // r1 = object->type
    // if (r1 is taggedInt) goto helper
    // Load inline cache
    //    if monomorphic
    //        r2 = address of the monomorphic inline cache
    //    if polymorphic
    //        r2 = address of the polymorphic inline cache array
    //        r3 = (type >> PIC shift amount) & (PIC size - 1)
    //        r2 = r2 + r3
    // Try store property using local cache
    //
    // Loading property using local cache:
    //    if (r1 == r2->u.local.type)
    //        store value to inline slot r2->u.local.slotIndex on r1
    //        goto fallthru
    //    if ((r1 | InlineCacheAuxSlotTypeTag) == r2->u.local.type)
    //        store value to aux slot r2->u.local.slotIndex on r1
    //        goto fallthru
    //
    // Storing to an inline slot:
    //    [r1 + slotIndex * sizeof(Var)] = value
    //
    // Storing to an aux slot:
    //    slotArray = r1->auxSlots
    //    [slotArray + slotIndex * sizeof(Var)] = value
    //
    // We don't emit the type check with aux slot tag if the profile data indicates that we didn't
    // store the property to an aux slot before.
    // We don't emit the type check without an aux slot tag if the profile data indicates that we didn't
    // store the property to an inline slot before.

    IR::Opnd * opndSrc = instrStFld->GetSrc1();
    IR::Opnd * opndDst = instrStFld->GetDst();
    AssertMsg(opndDst->IsSymOpnd() && opndDst->AsSymOpnd()->IsPropertySymOpnd() && opndDst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected PropertySym as dst of StFld");

    IR::PropertySymOpnd * propertySymOpnd = opndDst->AsPropertySymOpnd();
    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field store: %s, property ID: %u, func: %s, cache ID: %d, cloned cache: false\n"),
        Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode),
        propertySym->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex);

    Assert(pIsHelper != nullptr);
    bool& isHelper = *pIsHelper;

    Assert(pLabelHelper != nullptr);
    IR::LabelInstr*& labelHelper = *pLabelHelper;

    bool doStore = true;
    bool doAdd = false;
    bool doInlineSlots = true;
    bool doAuxSlots = true;
    if (!PHASE_OFF(Js::ProfileBasedFldFastPathPhase, this->m_func) && instrStFld->IsProfiledInstr())
    {
        IR::ProfiledInstr * profiledInstrStFld = instrStFld->AsProfiledInstr();
        if (profiledInstrStFld->u.FldInfo().flags != Js::FldInfo_NoInfo)
        {
            if (!(profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromLocal | Js::FldInfo_FromLocalWithoutProperty)))
            {
                return false;
            }

            if (!PHASE_OFF(Js::AddFldFastPathPhase, this->m_func))
            {
                // We always try to do the store field fast path, unless the profile specifically says we never set, but always add a property here.
                if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromLocal | Js::FldInfo_FromLocalWithoutProperty)) == Js::FldInfo_FromLocalWithoutProperty)
                {
                    doStore = false;
                }

                // On the other hand, we only emit the add field fast path, if the profile explicitly says we do add properties here.
                if (!!(profiledInstrStFld->u.FldInfo().flags & Js::FldInfo_FromLocalWithoutProperty))
                {
                    doAdd = true;
                }
            }
            else
            {
                #if ENABLE_DEBUG_CONFIG_OPTIONS
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                #endif
                PHASE_PRINT_TRACE(Js::AddFldFastPathPhase, this->m_func,
                    _u("AddFldFastPath: function: %s(%s) property ID: %u no fast path, because the phase is off.\n"),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                    propertySym->m_propertyId);
            }

            if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromInlineSlots | Js::FldInfo_FromAuxSlots)) == Js::FldInfo_FromInlineSlots)
            {
                // If the inline slots flag is set and the aux slots flag is not, only generate the inline slots check
                doAuxSlots = false;
            }
            else if ((profiledInstrStFld->u.FldInfo().flags & (Js::FldInfo_FromInlineSlots | Js::FldInfo_FromAuxSlots)) == Js::FldInfo_FromAuxSlots)
            {
                // If the aux slots flag is set and the inline slots flag is not, only generate the aux slots check
                doInlineSlots = false;
            }
        }
        else if (!profiledInstrStFld->u.FldInfo().valueType.IsUninitialized())
        {
            // We have value type info about the field but no flags. This means we shouldn't generate any
            // fast paths for this field store.
            return false;
        }
    }

    Assert(doStore || doAdd);

    if (labelHelper == nullptr)
    {
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    }

    IR::LabelInstr * labelFallThru = instrStFld->GetOrCreateContinueLabel();
    IR::RegOpnd * opndBase = propertySymOpnd->CreatePropertyOwnerOpnd(m_func);
    bool usePolymorphicInlineCache = !!propertySymOpnd->m_runtimePolymorphicInlineCache;

    if (doAdd)
    {
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        PHASE_PRINT_TRACE(Js::AddFldFastPathPhase, this->m_func,
            _u("AddFldFastPath: function: %s(%s) property ID: %d %s fast path for %s.\n"),
            this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
            propertySym->m_propertyId,
            usePolymorphicInlineCache ? _u("poly") : _u("mono"), doStore ? _u("store and add") : _u("add only"));
    }

    IR::RegOpnd * opndInlineCache = IR::RegOpnd::New(TyMachPtr, this->m_func);
    if (usePolymorphicInlineCache)
    {
        Lowerer::InsertMove(opndInlineCache, IR::AddrOpnd::New(propertySymOpnd->m_runtimePolymorphicInlineCache->GetInlineCachesAddr(), IR::AddrOpndKindDynamicInlineCache, this->m_func, true), instrStFld);
    }
    else
    {
        Lowerer::InsertMove(opndInlineCache, this->LoadRuntimeInlineCacheOpnd(instrStFld, propertySymOpnd, isHelper), instrStFld);
    }

    if (typeOpnd == nullptr)
    {
        typeOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
        GenerateObjectTestAndTypeLoad(instrStFld, opndBase, typeOpnd, labelHelper);
    }

    if (usePolymorphicInlineCache)
    {
        LowererMD::GenerateLoadPolymorphicInlineCacheSlot(instrStFld, opndInlineCache, typeOpnd, propertySymOpnd->m_runtimePolymorphicInlineCache->GetSize());
    }

    IR::LabelInstr * labelNext = nullptr;
    IR::RegOpnd * opndTaggedType = nullptr;
    IR::BranchInstr * lastBranchToNext = nullptr;

    if (doStore)
    {
        if (doInlineSlots)
        {
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, typeOpnd, opndInlineCache, labelNext);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, true);
            instrStFld->InsertBefore(labelNext);
        }
        if (doAuxSlots)
        {
            if (opndTaggedType == nullptr)
            {
                opndTaggedType = IR::RegOpnd::New(TyMachPtr, this->m_func);
                LowererMD::GenerateLoadTaggedType(instrStFld, typeOpnd, opndTaggedType);
            }
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, opndTaggedType, opndInlineCache, labelNext);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, false);
            instrStFld->InsertBefore(labelNext);
        }
    }

    if (doAdd)
    {
        if (doInlineSlots)
        {
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, typeOpnd, opndInlineCache, labelNext, true);
            GenerateSetObjectTypeFromInlineCache(instrStFld, opndBase, opndInlineCache, false);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, true);
            instrStFld->InsertBefore(labelNext);
        }
        if (doAuxSlots)
        {
            if (opndTaggedType == nullptr)
            {
                opndTaggedType = IR::RegOpnd::New(TyMachPtr, this->m_func);
                LowererMD::GenerateLoadTaggedType(instrStFld, typeOpnd, opndTaggedType);
            }
            labelNext = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
            lastBranchToNext = GenerateLocalInlineCacheCheck(instrStFld, opndTaggedType, opndInlineCache, labelNext, true);
            GenerateAuxSlotAdjustmentRequiredCheck(instrStFld, opndInlineCache, labelHelper);
            GenerateSetObjectTypeFromInlineCache(instrStFld, opndBase, opndInlineCache, true);
            this->GetLowererMD()->GenerateStFldFromLocalInlineCache(instrStFld, opndBase, opndSrc, opndInlineCache, labelFallThru, false);
            instrStFld->InsertBefore(labelNext);
        }
    }

    Assert(lastBranchToNext);
    lastBranchToNext->SetTarget(labelHelper);
    labelNext->Remove();

    // $helper:
    //     CALL Helper(inlineCache, base, field, src, scriptContext)
    // $fallthru:
    isHelper = true;

    // Return false to indicate the original instruction was not lowered.  Caller will insert the helper label.
    return false;
}